

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerMSL::add_argument_buffer_padding_buffer_type
          (CompilerMSL *this,SPIRType *struct_type,uint32_t *mbr_idx,uint32_t *arg_buff_index,
          MSLResourceBinding *rez_bind)

{
  uint local_58;
  TypedID<(spirv_cross::Types)1> local_54;
  uint32_t rez_idx;
  SPIRType *ptr_type;
  SPIRType *pSStack_40;
  uint32_t ptr_type_id;
  SPIRType *buff_type;
  MSLResourceBinding *pMStack_30;
  uint32_t buff_type_id;
  MSLResourceBinding *rez_bind_local;
  uint32_t *arg_buff_index_local;
  uint32_t *mbr_idx_local;
  SPIRType *struct_type_local;
  CompilerMSL *this_local;
  
  pMStack_30 = rez_bind;
  rez_bind_local = (MSLResourceBinding *)arg_buff_index;
  arg_buff_index_local = mbr_idx;
  mbr_idx_local = (uint32_t *)struct_type;
  struct_type_local = (SPIRType *)this;
  if (this->argument_buffer_padding_buffer_type_id == 0) {
    buff_type._4_4_ = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,2);
    pSStack_40 = Compiler::set<spirv_cross::SPIRType>((Compiler *)this,buff_type._4_4_);
    *(BaseType *)&(pSStack_40->super_IVariant).field_0xc = pMStack_30->basetype;
    pSStack_40->storage = StorageClassUniformConstant;
    ptr_type._4_4_ = buff_type._4_4_ + 1;
    _rez_idx = Compiler::set<spirv_cross::SPIRType>((Compiler *)this,ptr_type._4_4_);
    SPIRType::operator=(_rez_idx,pSStack_40);
    _rez_idx->pointer = true;
    _rez_idx->pointer_depth = _rez_idx->pointer_depth + 1;
    TypedID<(spirv_cross::Types)1>::TypedID(&local_54,buff_type._4_4_);
    (_rez_idx->parent_type).id = local_54.id;
    this->argument_buffer_padding_buffer_type_id = ptr_type._4_4_;
  }
  for (local_58 = 0; local_58 < pMStack_30->count; local_58 = local_58 + 1) {
    add_argument_buffer_padding_type
              (this,this->argument_buffer_padding_buffer_type_id,(SPIRType *)mbr_idx_local,
               arg_buff_index_local,&rez_bind_local->stage,1);
  }
  return;
}

Assistant:

void CompilerMSL::add_argument_buffer_padding_buffer_type(SPIRType &struct_type, uint32_t &mbr_idx,
                                                          uint32_t &arg_buff_index, MSLResourceBinding &rez_bind)
{
	if (!argument_buffer_padding_buffer_type_id)
	{
		uint32_t buff_type_id = ir.increase_bound_by(2);
		auto &buff_type = set<SPIRType>(buff_type_id);
		buff_type.basetype = rez_bind.basetype;
		buff_type.storage = StorageClassUniformConstant;

		uint32_t ptr_type_id = buff_type_id + 1;
		auto &ptr_type = set<SPIRType>(ptr_type_id);
		ptr_type = buff_type;
		ptr_type.pointer = true;
		ptr_type.pointer_depth++;
		ptr_type.parent_type = buff_type_id;

		argument_buffer_padding_buffer_type_id = ptr_type_id;
	}

	for (uint32_t rez_idx = 0; rez_idx < rez_bind.count; rez_idx++)
		add_argument_buffer_padding_type(argument_buffer_padding_buffer_type_id, struct_type, mbr_idx, arg_buff_index, 1);
}